

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O0

int Gia_ManCrossCut(Gia_Man_t *p,int fReverse)

{
  int iVar1;
  uint uVar2;
  Vec_Int_t *p_00;
  Gia_Obj_t *pGVar3;
  bool bVar4;
  int local_34;
  int local_30;
  int nCutMax;
  int nCutCur;
  int i;
  Gia_Obj_t *pObj;
  Vec_Int_t *vNodes;
  int fReverse_local;
  Gia_Man_t *p_local;
  
  local_30 = 0;
  local_34 = 0;
  p_00 = Gia_ManDfsForCrossCut(p,fReverse);
  nCutMax = 0;
  while( true ) {
    iVar1 = Vec_IntSize(p_00);
    bVar4 = false;
    if (nCutMax < iVar1) {
      iVar1 = Vec_IntEntry(p_00,nCutMax);
      _nCutCur = Gia_ManObj(p,iVar1);
      bVar4 = _nCutCur != (Gia_Obj_t *)0x0;
    }
    if (!bVar4) break;
    if (_nCutCur->Value != 0) {
      local_30 = local_30 + 1;
    }
    if (local_34 < local_30) {
      local_34 = local_30;
    }
    iVar1 = Gia_ObjIsAnd(_nCutCur);
    if (iVar1 == 0) {
      iVar1 = Gia_ObjIsCo(_nCutCur);
      if (iVar1 != 0) {
        pGVar3 = Gia_ObjFanin0(_nCutCur);
        uVar2 = pGVar3->Value - 1;
        pGVar3->Value = uVar2;
        if (uVar2 == 0) {
          local_30 = local_30 + -1;
        }
      }
    }
    else {
      pGVar3 = Gia_ObjFanin0(_nCutCur);
      uVar2 = pGVar3->Value - 1;
      pGVar3->Value = uVar2;
      if (uVar2 == 0) {
        local_30 = local_30 + -1;
      }
      pGVar3 = Gia_ObjFanin1(_nCutCur);
      uVar2 = pGVar3->Value - 1;
      pGVar3->Value = uVar2;
      if (uVar2 == 0) {
        local_30 = local_30 + -1;
      }
    }
    nCutMax = nCutMax + 1;
  }
  Vec_IntFree(p_00);
  nCutMax = 0;
  while( true ) {
    bVar4 = false;
    if (nCutMax < p->nObjs) {
      _nCutCur = Gia_ManObj(p,nCutMax);
      bVar4 = _nCutCur != (Gia_Obj_t *)0x0;
    }
    if (!bVar4) break;
    if (_nCutCur->Value != 0) {
      __assert_fail("pObj->Value == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaUtil.c"
                    ,0x34f,"int Gia_ManCrossCut(Gia_Man_t *, int)");
    }
    nCutMax = nCutMax + 1;
  }
  return local_34;
}

Assistant:

int Gia_ManCrossCut( Gia_Man_t * p, int fReverse )
{
    Vec_Int_t * vNodes;
    Gia_Obj_t * pObj;
    int i, nCutCur = 0, nCutMax = 0;
    vNodes = Gia_ManDfsForCrossCut( p, fReverse );
    Gia_ManForEachObjVec( vNodes, p, pObj, i )
    {
        if ( pObj->Value )
            nCutCur++;
        if ( nCutMax < nCutCur )
            nCutMax = nCutCur;
        if ( Gia_ObjIsAnd(pObj) )
        {
            if ( --Gia_ObjFanin0(pObj)->Value == 0 )
                nCutCur--;
            if ( --Gia_ObjFanin1(pObj)->Value == 0 )
                nCutCur--;
        }
        else if ( Gia_ObjIsCo(pObj) )
        {
            if ( --Gia_ObjFanin0(pObj)->Value == 0 )
                nCutCur--;
        }
    }
    Vec_IntFree( vNodes );
    Gia_ManForEachObj( p, pObj, i )
        assert( pObj->Value == 0 );
    return nCutMax;
}